

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O2

void __thiscall
Assimp::MD2Importer::InternReadFile
          (MD2Importer *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  ushort uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Header *pHVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined4 extraout_var;
  aiNode *this_00;
  uint *puVar16;
  aiMaterial **ppaVar17;
  aiMaterial *paVar18;
  aiMesh **ppaVar19;
  aiMesh *this_01;
  ulong *puVar20;
  aiFace *paVar21;
  aiVector3D *paVar22;
  size_t sVar23;
  Logger *pLVar24;
  ulong uVar25;
  DeadlyImportError *pDVar26;
  aiFace *paVar27;
  ulong uVar28;
  Header *pHVar29;
  float *pfVar30;
  ulong uVar31;
  char *__s;
  aiVector3D *vOut;
  long lVar32;
  float fVar33;
  float local_8b0;
  float local_8ac;
  long local_8a0;
  uint local_894;
  aiColor3D local_868;
  int iMode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mBuffer2;
  aiString szName;
  aiString sz;
  long *plVar15;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&szName,"rb",(allocator<char> *)&sz);
  iVar12 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,CONCAT44(szName.data._0_4_,szName.length)
                     );
  plVar15 = (long *)CONCAT44(extraout_var,iVar12);
  std::__cxx11::string::~string((string *)&szName);
  if (plVar15 == (long *)0x0) {
    pDVar26 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,
                   "Failed to open MD2 file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&szName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sz,"");
    DeadlyImportError::DeadlyImportError(pDVar26,(string *)&szName);
    __cxa_throw(pDVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar13 = (**(code **)(*plVar15 + 0x30))(plVar15);
  this->fileSize = uVar13;
  if ((uVar13 & 0xfffffffc) < 0x44) {
    pDVar26 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&szName,"MD2 File is too small",(allocator<char> *)&sz);
    DeadlyImportError::DeadlyImportError(pDVar26,(string *)&szName);
    __cxa_throw(pDVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&mBuffer2,(ulong)uVar13,(allocator_type *)&szName);
  (**(code **)(*plVar15 + 0x10))
            (plVar15,mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,1,this->fileSize);
  this->mBuffer =
       mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->m_pcHeader =
       (Header *)
       mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  ValidateHeader(this);
  pScene->mNumMaterials = 1;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  this_00->mNumMeshes = 1;
  puVar16 = (uint *)operator_new__(4);
  this_00->mMeshes = puVar16;
  *puVar16 = 0;
  ppaVar17 = (aiMaterial **)operator_new__(8);
  pScene->mMaterials = ppaVar17;
  paVar18 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar18);
  *pScene->mMaterials = paVar18;
  pScene->mNumMeshes = 1;
  ppaVar19 = (aiMesh **)operator_new__(8);
  pScene->mMeshes = ppaVar19;
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  *pScene->mMeshes = this_01;
  this_01->mPrimitiveTypes = 4;
  pHVar11 = this->m_pcHeader;
  uVar13 = pHVar11->offsetFrames;
  uVar14 = this->configFrameID;
  uVar7 = pHVar11->frameSize;
  uVar8 = pHVar11->offsetTriangles;
  uVar9 = pHVar11->numTriangles;
  uVar10 = pHVar11->offsetTexCoords;
  this_01->mNumFaces = uVar9;
  uVar31 = (ulong)pHVar11->numTriangles;
  puVar20 = (ulong *)operator_new__(uVar31 * 0x10 + 8);
  *puVar20 = uVar31;
  paVar21 = (aiFace *)(puVar20 + 1);
  if (uVar31 != 0) {
    paVar27 = paVar21;
    do {
      paVar27->mNumIndices = 0;
      paVar27->mIndices = (uint *)0x0;
      paVar27 = paVar27 + 1;
    } while (paVar27 != paVar21 + uVar31);
  }
  this_01->mFaces = paVar21;
  this_01->mNumVertices = uVar9 * 3;
  uVar31 = (ulong)(uVar9 * 3) * 0xc;
  paVar22 = (aiVector3D *)operator_new__(uVar31);
  if (uVar9 != 0) {
    memset(paVar22,0,((uVar31 - 0xc) - (uVar31 - 0xc) % 0xc) + 0xc);
  }
  this_01->mVertices = paVar22;
  paVar22 = (aiVector3D *)operator_new__(uVar31);
  if (uVar9 != 0) {
    memset(paVar22,0,((uVar31 - 0xc) - (uVar31 - 0xc) % 0xc) + 0xc);
  }
  this_01->mNormals = paVar22;
  paVar18 = *pScene->mMaterials;
  iMode = 2;
  aiMaterial::AddProperty<int>(paVar18,&iMode,1,"$mat.shadingm",0,0);
  pHVar29 = this->m_pcHeader;
  if ((pHVar29->numTexCoords == 0) || (pHVar29->numSkins == 0)) {
    local_868.r = 0.6;
    local_868.g = 0.6;
    local_868.b = 0.6;
    aiMaterial::AddProperty<aiColor3D>(paVar18,&local_868,1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty<aiColor3D>(paVar18,&local_868,1,"$clr.specular",0,0);
    local_868.r = 0.05;
    local_868.g = 0.05;
    local_868.b = 0.05;
    aiMaterial::AddProperty<aiColor3D>(paVar18,&local_868,1,"$clr.ambient",0,0);
    szName.length = 0;
    szName.data._0_4_ = szName.data._0_4_ & 0xffffff00;
    memset(szName.data + 1,0x1b,0x3ff);
    aiString::Set(&szName,"DefaultMaterial");
    aiMaterial::AddProperty(paVar18,&szName,"?mat.name",0,0);
    sz._0_8_ = (ulong)(uint3)sz.data._1_3_ << 0x28;
    memset(sz.data + 1,0x1b,0x3ff);
    aiString::Set(&sz,"$texture_dummy.bmp");
    aiMaterial::AddProperty(paVar18,&sz,"$tex.file",1,0);
  }
  else {
    uVar9 = pHVar29->offsetSkins;
    sz.length = 0x3f800000;
    sz.data[0] = '\0';
    sz.data[1] = '\0';
    sz.data[2] = -0x80;
    sz.data[3] = '?';
    sz.data[4] = '\0';
    sz.data[5] = '\0';
    sz.data[6] = -0x80;
    sz.data[7] = '?';
    aiMaterial::AddProperty<aiColor3D>(paVar18,(aiColor3D *)&sz,1,"$clr.diffuse",0,0);
    aiMaterial::AddProperty<aiColor3D>(paVar18,(aiColor3D *)&sz,1,"$clr.specular",0,0);
    sz.length = 0x3d4ccccd;
    sz.data[0] = -0x33;
    sz.data[1] = -0x34;
    sz.data[2] = 'L';
    sz.data[3] = '=';
    sz.data[4] = -0x33;
    sz.data[5] = -0x34;
    sz.data[6] = 'L';
    sz.data[7] = '=';
    aiMaterial::AddProperty<aiColor3D>(paVar18,(aiColor3D *)&sz,1,"$clr.ambient",0,0);
    __s = (char *)((long)&pHVar29->magic + (ulong)uVar9);
    if (*__s == '\0') {
      pLVar24 = DefaultLogger::get();
      Logger::warn(pLVar24,"Texture file name has zero length. It will be skipped.");
    }
    else {
      szName.data._0_4_ = szName.data._0_4_ & 0xffffff00;
      memset(szName.data + 1,0x1b,0x3ff);
      sVar23 = strlen(__s);
      memcpy(szName.data,__s,sVar23 & 0xffffffff);
      szName.data[sVar23 & 0xffffffff] = '\0';
      szName.length = (ai_uint32)sVar23;
      aiMaterial::AddProperty(paVar18,&szName,"$tex.file",1,0);
    }
  }
  pHVar29 = this->m_pcHeader;
  local_8ac = 1.0;
  local_8b0 = 1.0;
  if (pHVar29->numTexCoords != 0) {
    uVar9 = this_01->mNumVertices;
    uVar31 = (ulong)uVar9 * 0xc;
    paVar22 = (aiVector3D *)operator_new__(uVar31);
    if (uVar9 != 0) {
      uVar31 = uVar31 - 0xc;
      memset(paVar22,0,(uVar31 - uVar31 % 0xc) + 0xc);
    }
    this_01->mTextureCoords[0] = paVar22;
    this_01->mNumUVComponents[0] = 2;
    if (pHVar29->skinWidth == 0) {
      pLVar24 = DefaultLogger::get();
      Logger::error(pLVar24,"MD2: No valid skin width given");
      pHVar29 = this->m_pcHeader;
      local_8ac = 1.0;
    }
    else {
      local_8ac = (float)pHVar29->skinWidth;
    }
    if (pHVar29->skinHeight == 0) {
      pLVar24 = DefaultLogger::get();
      Logger::error(pLVar24,"MD2: No valid skin height given");
      local_8b0 = 1.0;
    }
    else {
      local_8b0 = (float)pHVar29->skinHeight;
    }
  }
  pfVar30 = (float *)((long)&pHVar11->magic + (ulong)(uVar14 * uVar7) + (ulong)uVar13);
  local_8a0 = (long)&pHVar11->version + (ulong)uVar8 + 2;
  local_894 = 0;
  for (uVar31 = 0; uVar31 < this->m_pcHeader->numTriangles; uVar31 = uVar31 + 1) {
    puVar16 = (uint *)operator_new__(0xc);
    (*pScene->mMeshes)->mFaces[uVar31].mIndices = puVar16;
    (*pScene->mMeshes)->mFaces[uVar31].mNumIndices = 3;
    for (lVar32 = 0; lVar32 != 3; lVar32 = lVar32 + 1) {
      uVar6 = *(ushort *)(local_8a0 + -6 + lVar32 * 2);
      uVar13 = (uint)uVar6;
      if (this->m_pcHeader->numVertices <= (uint)uVar6) {
        pLVar24 = DefaultLogger::get();
        Logger::error(pLVar24,"MD2: Vertex index is outside the allowed range");
        uVar13 = this->m_pcHeader->numVertices - 1;
      }
      paVar22 = this_01->mVertices;
      uVar25 = (ulong)uVar13;
      bVar5 = *(byte *)(pfVar30 + uVar25 + 10);
      uVar28 = (ulong)local_894 + lVar32 & 0xffffffff;
      fVar33 = *pfVar30;
      paVar22[uVar28].x = (float)bVar5 * fVar33;
      paVar22[uVar28].x = (float)bVar5 * fVar33 + pfVar30[3];
      fVar33 = (float)*(byte *)((long)pfVar30 + uVar25 * 4 + 0x29) * pfVar30[1];
      paVar22[uVar28].y = fVar33;
      paVar22[uVar28].y = fVar33 + pfVar30[4];
      fVar33 = (float)*(byte *)((long)pfVar30 + uVar25 * 4 + 0x2a) * pfVar30[2];
      paVar22[uVar28].z = fVar33;
      paVar22[uVar28].z = fVar33 + pfVar30[5];
      vOut = this_01->mNormals + uVar28;
      MD2::LookupNormalIndex(*(uint8_t *)((long)pfVar30 + uVar25 * 4 + 0x2b),vOut);
      uVar1 = vOut->y;
      uVar3 = vOut->z;
      vOut->y = (float)uVar3;
      vOut->z = (float)uVar1;
      uVar2 = paVar22[uVar28].y;
      uVar4 = paVar22[uVar28].z;
      paVar22[uVar28].y = (float)uVar4;
      paVar22[uVar28].z = (float)uVar2;
      uVar13 = this->m_pcHeader->numTexCoords;
      if (uVar13 != 0) {
        uVar6 = *(ushort *)(local_8a0 + lVar32 * 2);
        uVar14 = (uint)uVar6;
        if (uVar13 <= uVar6) {
          pLVar24 = DefaultLogger::get();
          Logger::error(pLVar24,"MD2: UV index is outside the allowed range");
          uVar14 = this->m_pcHeader->numTexCoords - 1;
        }
        paVar22 = this_01->mTextureCoords[0];
        paVar22[uVar28].x =
             (float)*(ushort *)((long)&pHVar11->magic + (ulong)uVar14 * 4 + (ulong)uVar10) /
             local_8ac;
        paVar22[uVar28].y =
             1.0 - (float)*(ushort *)((long)&pHVar11->magic + (ulong)uVar14 * 4 + (ulong)uVar10 + 2)
                   / local_8b0;
      }
      (*pScene->mMeshes)->mFaces[uVar31].mIndices[lVar32] = (uint)((ulong)local_894 + lVar32);
    }
    local_8a0 = local_8a0 + 0xc;
    local_894 = local_894 + 3;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&mBuffer2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  (**(code **)(*plVar15 + 8))(plVar15);
  return;
}

Assistant:

void MD2Importer::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open MD2 file " + pFile + "");

    // check whether the md3 file is large enough to contain
    // at least the file header
    fileSize = (unsigned int)file->FileSize();
    if( fileSize < sizeof(MD2::Header))
        throw DeadlyImportError( "MD2 File is too small");

    std::vector<uint8_t> mBuffer2(fileSize);
    file->Read(&mBuffer2[0], 1, fileSize);
    mBuffer = &mBuffer2[0];


    m_pcHeader = (BE_NCONST MD2::Header*)mBuffer;

#ifdef AI_BUILD_BIG_ENDIAN

    ByteSwap::Swap4(&m_pcHeader->frameSize);
    ByteSwap::Swap4(&m_pcHeader->magic);
    ByteSwap::Swap4(&m_pcHeader->numFrames);
    ByteSwap::Swap4(&m_pcHeader->numGlCommands);
    ByteSwap::Swap4(&m_pcHeader->numSkins);
    ByteSwap::Swap4(&m_pcHeader->numTexCoords);
    ByteSwap::Swap4(&m_pcHeader->numTriangles);
    ByteSwap::Swap4(&m_pcHeader->numVertices);
    ByteSwap::Swap4(&m_pcHeader->offsetEnd);
    ByteSwap::Swap4(&m_pcHeader->offsetFrames);
    ByteSwap::Swap4(&m_pcHeader->offsetGlCommands);
    ByteSwap::Swap4(&m_pcHeader->offsetSkins);
    ByteSwap::Swap4(&m_pcHeader->offsetTexCoords);
    ByteSwap::Swap4(&m_pcHeader->offsetTriangles);
    ByteSwap::Swap4(&m_pcHeader->skinHeight);
    ByteSwap::Swap4(&m_pcHeader->skinWidth);
    ByteSwap::Swap4(&m_pcHeader->version);

#endif

    ValidateHeader();

    // there won't be more than one mesh inside the file
    pScene->mNumMaterials = 1;
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int[1];
    pScene->mRootNode->mMeshes[0] = 0;
    pScene->mMaterials = new aiMaterial*[1];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];

    aiMesh* pcMesh = pScene->mMeshes[0] = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    // navigate to the begin of the current frame data
	BE_NCONST MD2::Frame* pcFrame = (BE_NCONST MD2::Frame*) ((uint8_t*)
		m_pcHeader + m_pcHeader->offsetFrames + (m_pcHeader->frameSize * configFrameID));

    // navigate to the begin of the triangle data
    MD2::Triangle* pcTriangles = (MD2::Triangle*) ((uint8_t*)
        m_pcHeader + m_pcHeader->offsetTriangles);

    // navigate to the begin of the tex coords data
    BE_NCONST MD2::TexCoord* pcTexCoords = (BE_NCONST MD2::TexCoord*) ((uint8_t*)
        m_pcHeader + m_pcHeader->offsetTexCoords);

    // navigate to the begin of the vertex data
    BE_NCONST MD2::Vertex* pcVerts = (BE_NCONST MD2::Vertex*) (pcFrame->vertices);

#ifdef AI_BUILD_BIG_ENDIAN
    for (uint32_t i = 0; i< m_pcHeader->numTriangles; ++i)
    {
        for (unsigned int p = 0; p < 3;++p)
        {
            ByteSwap::Swap2(& pcTriangles[i].textureIndices[p]);
            ByteSwap::Swap2(& pcTriangles[i].vertexIndices[p]);
        }
    }
    for (uint32_t i = 0; i < m_pcHeader->offsetTexCoords;++i)
    {
        ByteSwap::Swap2(& pcTexCoords[i].s);
        ByteSwap::Swap2(& pcTexCoords[i].t);
    }
    ByteSwap::Swap4( & pcFrame->scale[0] );
    ByteSwap::Swap4( & pcFrame->scale[1] );
    ByteSwap::Swap4( & pcFrame->scale[2] );
    ByteSwap::Swap4( & pcFrame->translate[0] );
    ByteSwap::Swap4( & pcFrame->translate[1] );
    ByteSwap::Swap4( & pcFrame->translate[2] );
#endif

    pcMesh->mNumFaces = m_pcHeader->numTriangles;
    pcMesh->mFaces = new aiFace[m_pcHeader->numTriangles];

    // allocate output storage
    pcMesh->mNumVertices = (unsigned int)pcMesh->mNumFaces*3;
    pcMesh->mVertices = new aiVector3D[pcMesh->mNumVertices];
    pcMesh->mNormals = new aiVector3D[pcMesh->mNumVertices];

    // Not sure whether there are MD2 files without texture coordinates
    // NOTE: texture coordinates can be there without a texture,
    // but a texture can't be there without a valid UV channel
    aiMaterial* pcHelper = (aiMaterial*)pScene->mMaterials[0];
    const int iMode = (int)aiShadingMode_Gouraud;
    pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

    if (m_pcHeader->numTexCoords && m_pcHeader->numSkins)
    {
        // navigate to the first texture associated with the mesh
        const MD2::Skin* pcSkins = (const MD2::Skin*) ((unsigned char*)m_pcHeader +
            m_pcHeader->offsetSkins);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 1.0f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        if (pcSkins->name[0])
        {
            aiString szString;
            const ai_uint32 iLen = (ai_uint32) ::strlen(pcSkins->name);
            ::memcpy(szString.data,pcSkins->name,iLen);
            szString.data[iLen] = '\0';
            szString.length = iLen;

            pcHelper->AddProperty(&szString,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
        else{
            ASSIMP_LOG_WARN("Texture file name has zero length. It will be skipped.");
        }
    }
    else    {
        // apply a default material
        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.6f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

        aiString sz;

        // TODO: Try to guess the name of the texture file from the model file name

        sz.Set("$texture_dummy.bmp");
        pcHelper->AddProperty(&sz,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }


    // now read all triangles of the first frame, apply scaling and translation
    unsigned int iCurrent = 0;

    float fDivisorU = 1.0f,fDivisorV = 1.0f;
    if (m_pcHeader->numTexCoords)   {
        // allocate storage for texture coordinates, too
        pcMesh->mTextureCoords[0] = new aiVector3D[pcMesh->mNumVertices];
        pcMesh->mNumUVComponents[0] = 2;

        // check whether the skin width or height are zero (this would
        // cause a division through zero)
        if (!m_pcHeader->skinWidth) {
            ASSIMP_LOG_ERROR("MD2: No valid skin width given");
        }
        else fDivisorU = (float)m_pcHeader->skinWidth;
        if (!m_pcHeader->skinHeight){
            ASSIMP_LOG_ERROR("MD2: No valid skin height given");
        }
        else fDivisorV = (float)m_pcHeader->skinHeight;
    }

    for (unsigned int i = 0; i < (unsigned int)m_pcHeader->numTriangles;++i)    {
        // Allocate the face
        pScene->mMeshes[0]->mFaces[i].mIndices = new unsigned int[3];
        pScene->mMeshes[0]->mFaces[i].mNumIndices = 3;

        // copy texture coordinates
        // check whether they are different from the previous value at this index.
        // In this case, create a full separate set of vertices/normals/texcoords
        for (unsigned int c = 0; c < 3;++c,++iCurrent)  {

            // validate vertex indices
            unsigned int iIndex = (unsigned int)pcTriangles[i].vertexIndices[c];
            if (iIndex >= m_pcHeader->numVertices)  {
                ASSIMP_LOG_ERROR("MD2: Vertex index is outside the allowed range");
                iIndex = m_pcHeader->numVertices-1;
            }

            // read x,y, and z component of the vertex
            aiVector3D& vec = pcMesh->mVertices[iCurrent];

            vec.x = (float)pcVerts[iIndex].vertex[0] * pcFrame->scale[0];
            vec.x += pcFrame->translate[0];

            vec.y = (float)pcVerts[iIndex].vertex[1] * pcFrame->scale[1];
            vec.y += pcFrame->translate[1];

            vec.z = (float)pcVerts[iIndex].vertex[2] * pcFrame->scale[2];
            vec.z += pcFrame->translate[2];

            // read the normal vector from the precalculated normal table
            aiVector3D& vNormal = pcMesh->mNormals[iCurrent];
            LookupNormalIndex(pcVerts[iIndex].lightNormalIndex,vNormal);

            // flip z and y to become right-handed
            std::swap((float&)vNormal.z,(float&)vNormal.y);
            std::swap((float&)vec.z,(float&)vec.y);

            if (m_pcHeader->numTexCoords)   {
                // validate texture coordinates
                iIndex = pcTriangles[i].textureIndices[c];
                if (iIndex >= m_pcHeader->numTexCoords) {
                    ASSIMP_LOG_ERROR("MD2: UV index is outside the allowed range");
                    iIndex = m_pcHeader->numTexCoords-1;
                }

                aiVector3D& pcOut = pcMesh->mTextureCoords[0][iCurrent];

                // the texture coordinates are absolute values but we
                // need relative values between 0 and 1
                pcOut.x = pcTexCoords[iIndex].s / fDivisorU;
                pcOut.y = 1.f-pcTexCoords[iIndex].t / fDivisorV;
            }
            pScene->mMeshes[0]->mFaces[i].mIndices[c] = iCurrent;
        }
    }
}